

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O0

pair<unsigned_long,_bool>
detail::do_try_get_deserialized_size<std::pair<person,person>>(undefined8 param_1,byte *param_2)

{
  type tVar1;
  pair<unsigned_long,_bool> pVar2;
  pair<type_tag<person>,_type_tag<person>_> local_3a;
  anon_class_8_1_4eff857e local_38 [2];
  undefined1 local_28 [8];
  span<const_std::byte> buffer_local;
  
  local_38[0].buffer = (span<const_std::byte> *)local_28;
  local_28 = (undefined1  [8])param_1;
  buffer_local.begin_ = param_2;
  std::pair<type_tag<person>,_type_tag<person>_>::pair<type_tag<person>,_type_tag<person>,_true>
            (&local_3a);
  tVar1 = std::
          apply<detail::do_try_get_deserialized_size<std::pair<person,person>>(span<std::byte_const>,value_tag<(serialization_category)6>)::_lambda((auto:1)___)_1_,std::pair<type_tag<person>,type_tag<person>>>
                    (local_38,&local_3a);
  pVar2.first = tVar1.first;
  pVar2.second = tVar1.second;
  pVar2._9_7_ = tVar1._9_7_;
  return pVar2;
}

Assistant:

std::pair<size_t, bool> do_try_get_deserialized_size(span<std::byte const> buffer, value_tag<serialization_category::tuple>) noexcept {
        return std::apply([&] (auto...tags) {
            auto const data_begin = buffer.begin();
            auto const try_one    = [&] (auto tag) {
                using value_type = remove_deep_constness_t<typename decltype(tag)::type>;
                auto const [size, success] = try_get_deserialized_size<value_type>(buffer);
                if (!success) return false;
                buffer.begin() += size;
                return true;
            };
            auto const success = (try_one(tags) && ...);
            return std::pair<size_t, bool>{ buffer.begin() - data_begin, success };
        }, map_tuple_types_t<T, tag_type>{});
    }